

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

void __thiscall ObjectFile::~ObjectFile(ObjectFile *this)

{
  MutexFactory *this_00;
  OSObject *in_RDI;
  ObjectFile *in_stack_00000050;
  Mutex *in_stack_ffffffffffffffd8;
  
  in_RDI->_vptr_OSObject = (_func_int **)&PTR__ObjectFile_00223928;
  discardAttributes(in_stack_00000050);
  if ((in_RDI[6]._vptr_OSObject != (_func_int **)0x0) &&
     (in_RDI[6]._vptr_OSObject != (_func_int **)0x0)) {
    (**(code **)(*in_RDI[6]._vptr_OSObject + 8))();
  }
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string((string *)(in_RDI + 0x12));
  std::
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  ::~map((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
          *)0x1d55d1);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  OSObject::~OSObject(in_RDI);
  return;
}

Assistant:

ObjectFile::~ObjectFile()
{
	discardAttributes();

	if (gen != NULL)
	{
		delete gen;
	}

	MutexFactory::i()->recycleMutex(objectMutex);
}